

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkDirFrame::SetDirectionInAbsoluteCoords
          (ChLinkDirFrame *this,ChVector<double> *dir_abs)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChVector<double> dir_loc;
  ChVector<double> local_18;
  
  peVar8 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar8 != (element_type *)0x0) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dir_abs->m_data[0];
    dVar1 = dir_abs->m_data[1];
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         dVar1 * *(double *)
                  ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x18);
    auVar2 = vfmadd231sd_fma(auVar11,auVar9,auVar2);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dir_abs->m_data[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *(double *)
                    ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x30);
    auVar2 = vfmadd231sd_fma(auVar2,auVar12,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(double *)
                    ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 8);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         dVar1 * *(double *)
                  ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x20);
    auVar3 = vfmadd231sd_fma(auVar13,auVar9,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(double *)
                    ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x38);
    auVar3 = vfmadd231sd_fma(auVar3,auVar12,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(double *)
                    ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x10);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         dVar1 * *(double *)
                  ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                          super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x28);
    auVar4 = vfmadd231sd_fma(auVar10,auVar9,auVar6);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(double *)
                    ((long)&(peVar8->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                            super_Matrix<double,_3,_3,_1,_3,_3>.
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> + 0x40);
    auVar4 = vfmadd231sd_fma(auVar4,auVar12,auVar7);
    local_18.m_data[0] = auVar2._0_8_;
    local_18.m_data[1] = auVar3._0_8_;
    local_18.m_data[2] = auVar4._0_8_;
    SetDirectionInBodyCoords(this,&local_18);
    return;
  }
  __assert_fail("m_body",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChLinkDirFrame.cpp"
                ,0x31,
                "void chrono::fea::ChLinkDirFrame::SetDirectionInAbsoluteCoords(const ChVector<> &)"
               );
}

Assistant:

void ChLinkDirFrame::SetDirectionInAbsoluteCoords(const ChVector<>& dir_abs) {
    assert(m_body);
    ChVector<> dir_loc = m_body->TransformDirectionParentToLocal(dir_abs);
    SetDirectionInBodyCoords(dir_loc);
}